

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool condition;
  mapped_type *this_00;
  ArrayView<soul::Type> local_78;
  vector<soul::Type,_std::allocator<soul::Type>_> local_68;
  string *local_50;
  pool_ptr<soul::heart::InputDeclaration> local_48 [3];
  pool_ref<const_soul::heart::InputDeclaration> local_30;
  mapped_type *local_28;
  mapped_type *mapping;
  InputDeclaration *io;
  InputDeclaration *old_local;
  ModuleCloner *this_local;
  
  io = (InputDeclaration *)__fn;
  old_local = (InputDeclaration *)this;
  mapping = (mapped_type *)
            Module::allocate<soul::heart::InputDeclaration,soul::CodeLocation_const&>
                      (this->newModule,(CodeLocation *)(__fn + 8));
  pool_ref<soul::heart::InputDeclaration_const>::pool_ref<soul::heart::InputDeclaration_const,void>
            ((pool_ref<soul::heart::InputDeclaration_const> *)&local_30,io);
  this_00 = std::
            unordered_map<soul::pool_ref<const_soul::heart::InputDeclaration>,_soul::pool_ptr<soul::heart::InputDeclaration>,_std::hash<soul::pool_ref<const_soul::heart::InputDeclaration>_>,_std::equal_to<soul::pool_ref<const_soul::heart::InputDeclaration>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::InputDeclaration>,_soul::pool_ptr<soul::heart::InputDeclaration>_>_>_>
            ::operator[](&this->inputMappings,(key_type *)&local_30);
  pool_ref<const_soul::heart::InputDeclaration>::~pool_ref(&local_30);
  local_28 = this_00;
  condition = pool_ptr<soul::heart::InputDeclaration>::operator==(this_00,(void *)0x0);
  checkAssertion(condition,"mapping == nullptr","clone",0xb4);
  pool_ptr<soul::heart::InputDeclaration>::pool_ptr<soul::heart::InputDeclaration,void>
            (local_48,(InputDeclaration *)mapping);
  local_28->object = local_48[0].object;
  pool_ptr<soul::heart::InputDeclaration>::~pool_ptr(local_48);
  local_50 = (string *)
             heart::Allocator::get<soul::Identifier>
                       (this->newModule->allocator,&(io->super_IODeclaration).name);
  mapping[3].object = (InputDeclaration *)local_50;
  *(uint32_t *)&mapping[4].object = (io->super_IODeclaration).index;
  *(EndpointType *)((long)&mapping[4].object + 4) = (io->super_IODeclaration).endpointType;
  ArrayView<soul::Type>::ArrayView<std::vector<soul::Type,std::allocator<soul::Type>>>
            (&local_78,&(io->super_IODeclaration).dataTypes);
  cloneTypes(&local_68,this,local_78);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::operator=
            ((vector<soul::Type,_std::allocator<soul::Type>_> *)(mapping + 5),&local_68);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
  Annotation::operator=((Annotation *)(mapping + 9),&(io->super_IODeclaration).annotation);
  mapping[8].object =
       (InputDeclaration *)
       (io->super_IODeclaration).arraySize.super__Optional_base<unsigned_int,_true,_true>._M_payload
       .super__Optional_payload_base<unsigned_int>;
  return (int)mapping;
}

Assistant:

heart::InputDeclaration& clone (const heart::InputDeclaration& old)
    {
        auto& io = newModule.allocate<heart::InputDeclaration> (old.location);
        auto& mapping = inputMappings[old];
        SOUL_ASSERT (mapping == nullptr);
        mapping = io;
        io.name = newModule.allocator.get (old.name);
        io.index = old.index;
        io.endpointType = old.endpointType;
        io.dataTypes = cloneTypes (old.dataTypes);
        io.annotation = old.annotation;
        io.arraySize = old.arraySize;
        return io;
    }